

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::CDictionary(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,int initialCapacity)

{
  int initialCapacity_local;
  CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->size = 0;
  this->capacity = 0;
  this->keyDataPairs = (CKeyDataPair *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->keyToIndex);
  SetCapacity(this,initialCapacity);
  return;
}

Assistant:

CDictionary<Data, Key>::CDictionary( int initialCapacity ):
	size( 0 ),
	capacity( 0 ),
	keyDataPairs( 0 )
{
	SetCapacity( initialCapacity );
}